

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

Qiniu_Error
Qiniu_Client_CallWithBinaryAndProgressCallback
          (Qiniu_Client *self,Qiniu_Json **ret,char *url,Qiniu_Reader body,Qiniu_Int64 bodyLen,
          char *mimeType,_func_int_void_ptr_double_double_double_double *callback,void *callbackData
          )

{
  CURL *pCVar1;
  Qiniu_Error QVar2;
  CURL *curl;
  Qiniu_Int64 bodyLen_local;
  char *url_local;
  Qiniu_Json **ret_local;
  Qiniu_Client *self_local;
  Qiniu_Reader body_local;
  
  pCVar1 = Qiniu_Client_initcall(self,url);
  curl_easy_setopt(pCVar1,0x75a3,bodyLen);
  curl_easy_setopt(pCVar1,0x4e2c,body.Read);
  curl_easy_setopt(pCVar1,0x2719,body.self);
  if (callback == (_func_int_void_ptr_double_double_double_double *)0x0) {
    curl_easy_setopt(pCVar1,0x2b,1);
  }
  else {
    curl_easy_setopt(pCVar1,0x4e58,callback);
    curl_easy_setopt(pCVar1,0x2749,callbackData);
    curl_easy_setopt(pCVar1,0x2b,0);
  }
  QVar2 = Qiniu_Client_callWithBody(self,ret,url,(char *)0x0,bodyLen,mimeType,(char *)0x0);
  QVar2._4_4_ = 0;
  return QVar2;
}

Assistant:

Qiniu_Error Qiniu_Client_CallWithBinaryAndProgressCallback(
    Qiniu_Client *self, Qiniu_Json **ret, const char *url,
    Qiniu_Reader body, Qiniu_Int64 bodyLen, const char *mimeType,
    int (*callback)(void *, double, double, double, double), void *callbackData)
{
    CURL *curl = Qiniu_Client_initcall(self, url);

    curl_easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, bodyLen);
    curl_easy_setopt(curl, CURLOPT_READFUNCTION, body.Read);
    curl_easy_setopt(curl, CURLOPT_READDATA, body.self);
    if (callback != NULL)
    {
        curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, callback);
        curl_easy_setopt(curl, CURLOPT_PROGRESSDATA, callbackData);
        curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    }
    else
    {
        curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 1);
    }

    return Qiniu_Client_callWithBody(self, ret, url, NULL, bodyLen, mimeType, NULL);
}